

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-timesamples.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseTimeSampleValue
          (AsciiParser *this,string *type_name,Value *result)

{
  bool bVar1;
  ostream *poVar2;
  value_type_conflict1 *pvVar3;
  string local_1f0;
  string local_1d0 [32];
  ostringstream local_1b0 [8];
  ostringstream ss_e;
  optional<unsigned_int> local_38;
  optional<unsigned_int> local_30;
  optional<unsigned_int> type_id;
  Value *result_local;
  string *type_name_local;
  AsciiParser *this_local;
  
  type_id = (optional<unsigned_int>)result;
  tinyusdz::value::TryGetTypeId(&local_38,type_name);
  nonstd::optional_lite::optional<unsigned_int>::optional<unsigned_int,_0>(&local_30,&local_38);
  nonstd::optional_lite::optional<unsigned_int>::~optional(&local_38);
  bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&local_30);
  if (bVar1) {
    pvVar3 = nonstd::optional_lite::optional<unsigned_int>::value(&local_30);
    this_local._7_1_ = ParseTimeSampleValue(this,*pvVar3,(Value *)type_id);
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_1b0);
    poVar2 = ::std::operator<<((ostream *)local_1b0,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ParseTimeSampleValue");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xa4);
    ::std::operator<<(poVar2," ");
    ::std::operator+((char *)local_1d0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "Unsupported/invalid timeSamples type ");
    poVar2 = ::std::operator<<((ostream *)local_1b0,local_1d0);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::string::~string(local_1d0);
    ::std::__cxx11::ostringstream::str();
    PushError(this,&local_1f0);
    ::std::__cxx11::string::~string((string *)&local_1f0);
    this_local._7_1_ = false;
    ::std::__cxx11::ostringstream::~ostringstream(local_1b0);
  }
  nonstd::optional_lite::optional<unsigned_int>::~optional(&local_30);
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::ParseTimeSampleValue(const std::string &type_name, value::Value *result) {

  nonstd::optional<uint32_t> type_id = value::TryGetTypeId(type_name);

  if (!type_id) {
    PUSH_ERROR_AND_RETURN("Unsupported/invalid timeSamples type " + type_name);
  }

  return ParseTimeSampleValue(type_id.value(), result);
}